

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zetMetricQueryReset(zet_metric_query_handle_t hMetricQuery)

{
  zet_pfnMetricQueryReset_t pfnReset;
  dditable_t *dditable;
  ze_result_t result;
  zet_metric_query_handle_t hMetricQuery_local;
  
  if (*(code **)(*(long *)(hMetricQuery + 8) + 0x7e8) == (code *)0x0) {
    hMetricQuery_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hMetricQuery_local._4_4_ =
         (**(code **)(*(long *)(hMetricQuery + 8) + 0x7e8))(*(undefined8 *)hMetricQuery);
  }
  return hMetricQuery_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricQueryReset(
        zet_metric_query_handle_t hMetricQuery          ///< [in] handle of metric query
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_metric_query_object_t*>( hMetricQuery )->dditable;
        auto pfnReset = dditable->zet.MetricQuery.pfnReset;
        if( nullptr == pfnReset )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hMetricQuery = reinterpret_cast<zet_metric_query_object_t*>( hMetricQuery )->handle;

        // forward to device-driver
        result = pfnReset( hMetricQuery );

        return result;
    }